

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Adventure.cpp
# Opt level: O0

void __thiscall Adventure::begin(Adventure *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined4 local_28c;
  shared_ptr<BlessedSword> local_288;
  shared_ptr<Item> local_278;
  undefined4 local_264;
  shared_ptr<HealthItem> local_260;
  shared_ptr<Item> local_250;
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_240;
  allocator local_219;
  string local_218 [32];
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_1f8;
  allocator local_1d1;
  string local_1d0 [32];
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_1b0;
  allocator local_189;
  string local_188 [32];
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_168;
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  undefined1 local_100 [8];
  Player player;
  string local_30 [8];
  string command;
  Adventure *this_local;
  
  std::__cxx11::string::string(local_30);
  poVar3 = std::operator<<((ostream *)&std::cout,"Welcome, brave soul. Pray tell, what is thy name?"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"> ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  std::__cxx11::string::string(local_120,local_30);
  Player::Player((Player *)local_100,(string *)local_120,100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"smack",&local_141);
  std::
  function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<bool(&)(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>),void>
            ((function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&local_168,smack);
  Player::registerAction((Player *)local_100,(string *)local_140,&local_168);
  std::
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_168);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"look",&local_189);
  std::
  function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<bool(&)(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>),void>
            ((function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&local_1b0,look);
  Player::registerAction((Player *)local_100,(string *)local_188,&local_1b0);
  std::
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_1b0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"move",&local_1d1);
  std::
  function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<bool(&)(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>),void>
            ((function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&local_1f8,doMove);
  Player::registerAction((Player *)local_100,(string *)local_1d0,&local_1f8);
  std::
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"go",&local_219);
  std::
  function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<bool(&)(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>),void>
            ((function<bool(Player&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&local_240,doMove);
  Player::registerAction((Player *)local_100,(string *)local_218,&local_240);
  std::
  function<bool_(Player_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_240);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  local_264 = 0x14;
  std::make_shared<HealthItem,int>((int *)&local_260);
  std::shared_ptr<Item>::shared_ptr<HealthItem,void>(&local_250,&local_260);
  Player::addItem((Player *)local_100,&local_250);
  std::shared_ptr<Item>::~shared_ptr(&local_250);
  std::shared_ptr<HealthItem>::~shared_ptr(&local_260);
  local_28c = 10;
  std::make_shared<BlessedSword,int>((int *)&local_288);
  std::shared_ptr<Item>::shared_ptr<BlessedSword,void>(&local_278,&local_288);
  Player::addItem((Player *)local_100,&local_278);
  std::shared_ptr<Item>::~shared_ptr(&local_278);
  std::shared_ptr<BlessedSword>::~shared_ptr(&local_288);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&player);
  poVar3 = std::operator<<(poVar3,
                           "! Your presence defiles these sacred grounds. Beware the soil upon which you step, for it will claim you sooner rather than later."
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Player::look((Player *)local_100);
  while (iVar2 = Entity::getHealth((Entity *)local_100), 0 < iVar2) {
    std::operator<<((ostream *)&std::cout,"> ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
    split(&local_2a8,(string *)local_30);
    bVar1 = Player::act((Player *)local_100,&local_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2a8);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Unknown command");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"You died. Game over.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Player::~Player((Player *)local_100);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Adventure::begin()
{
  std::string command;
  std::cout << "Welcome, brave soul. Pray tell, what is thy name?" << std::endl;
  std::cout << "> ";
  std::getline(std::cin, command);

  Player player(command, 100);
  player.registerAction("smack", smack);
  player.registerAction("look", look);
  player.registerAction("move", doMove);
  player.registerAction("go", doMove);
  player.addItem(std::make_shared<HealthItem>(20));
  player.addItem(std::make_shared<BlessedSword>(10));

  std::cout << player.name << "! Your presence defiles these sacred grounds. Beware the soil upon which you step, for it will claim you sooner rather than later." << std::endl;
  player.look();

  while(player.getHealth() > 0)
  {
    std::cout << "> ";
    std::getline(std::cin, command);
    if(player.act(split(command)) == false)
      std::cout << "Unknown command" << std::endl;
  }

  std::cout << "You died. Game over." << std::endl;
}